

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resSim.c
# Opt level: O1

void Res_SimPerformRound(Res_Sim_t *p,int nWords)

{
  Abc_Obj_t *pNode;
  Vec_Ptr_t *pVVar1;
  char *__assertion;
  long lVar2;
  
  if (p->vPats->nSize < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  memset(*p->vPats->pArray,0xff,(long)nWords << 2);
  pVVar1 = p->pAig->vObjs;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar1->pArray[lVar2];
      if (pNode != (Abc_Obj_t *)0x0) {
        if (((ulong)pNode & 1) != 0) {
          __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_00467096:
          __assert_fail(__assertion,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
        }
        if (pNode->pNtk->ntkType != ABC_NTK_STRASH) {
          __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
          goto LAB_00467096;
        }
        if ((pNode->vFanins).nSize == 2) {
          Res_SimPerformOne(pNode,p->vPats,nWords);
        }
      }
      lVar2 = lVar2 + 1;
      pVVar1 = p->pAig->vObjs;
    } while (lVar2 < pVVar1->nSize);
  }
  pVVar1 = p->pAig->vPos;
  if (0 < pVVar1->nSize) {
    lVar2 = 0;
    do {
      Res_SimTransferOne((Abc_Obj_t *)pVVar1->pArray[lVar2],p->vPats,nWords);
      lVar2 = lVar2 + 1;
      pVVar1 = p->pAig->vPos;
    } while (lVar2 < pVVar1->nSize);
  }
  return;
}

Assistant:

void Res_SimPerformRound( Res_Sim_t * p, int nWords )
{
    Abc_Obj_t * pObj;
    int i;
    Abc_InfoFill( (unsigned *)Vec_PtrEntry(p->vPats,0), nWords );
    Abc_AigForEachAnd( p->pAig, pObj, i )
        Res_SimPerformOne( pObj, p->vPats, nWords );
    Abc_NtkForEachPo( p->pAig, pObj, i )
        Res_SimTransferOne( pObj, p->vPats, nWords );
}